

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall CaDiCaL::Solver::flip(Solver *this,int lit)

{
  uint uVar1;
  FILE *pFVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  pointer puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  undefined1 extraout_AL_02;
  undefined1 extraout_AL_03;
  undefined1 extraout_AL_04;
  undefined1 extraout_AL_05;
  uint uVar23;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 extraout_AL_06;
  char cVar22;
  undefined1 extraout_AL_07;
  undefined1 extraout_AL_08;
  undefined1 extraout_AL_09;
  undefined1 extraout_AL_10;
  undefined1 extraout_AL_11;
  undefined1 extraout_AL_12;
  undefined1 extraout_AL_13;
  undefined1 extraout_AL_14;
  int iVar24;
  size_t sVar25;
  size_t sVar26;
  Internal *pIVar27;
  File *file;
  char *__s;
  char *__s_00;
  char *__s_01;
  char cVar28;
  undefined8 in_RCX;
  External *pEVar29;
  External *pEVar30;
  CaDiCaL *pCVar31;
  long *plVar32;
  Solver *pSVar33;
  bool antecedents;
  bool antecedents_00;
  bool antecedents_01;
  bool antecedents_02;
  Internal *this_00;
  uint uVar34;
  External *pEVar35;
  External *pEVar36;
  CaDiCaL *pCVar37;
  Solver *pSVar38;
  Solver *pSVar39;
  undefined1 print;
  char *pcVar40;
  char *pcVar41;
  char *pcVar42;
  Internal *pIVar43;
  undefined1 *this_01;
  bool bVar44;
  bool bVar45;
  
  pEVar30 = (External *)(ulong)(uint)lit;
  bVar44 = this->internal == (Internal *)0x0;
  pFVar2 = (FILE *)this->trace_api_file;
  pEVar29 = (External *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pEVar29 = pEVar30;
    fprintf(pFVar2,"%s %d\n","flip");
    fflush((FILE *)this->trace_api_file);
  }
  pcVar40 = "bool CaDiCaL::Solver::flip(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::flip(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pEVar29);
  pEVar36 = this->external;
  if (pEVar36 == (External *)0x0) {
    flip();
LAB_0083d55b:
    flip();
LAB_0083d560:
    flip();
LAB_0083d565:
    flip((Solver *)pEVar30);
    pEVar36 = pEVar30;
LAB_0083d56c:
    flip();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0083d55b;
    if ((this->_state & VALID) == 0) goto LAB_0083d560;
    if ((lit & 0x7fffffffU) == 0) goto LAB_0083d565;
    if (this->_state != SATISFIED) goto LAB_0083d56c;
    if (pEVar36->propagator == (ExternalPropagator *)0x0) {
      bVar44 = External::flip(pEVar36,lit);
      return bVar44;
    }
  }
  flip();
  pEVar35 = (External *)((ulong)pcVar40 & 0xffffffff);
  bVar44 = *(long *)&pEVar36->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar36->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pEVar30 = (External *)CONCAT71((int7)((ulong)pEVar29 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pEVar30 = pEVar35;
    fprintf(pFVar2,"%s %d\n","flippable");
    fflush(*(FILE **)&(pEVar36->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar41 = "bool CaDiCaL::Solver::flippable(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar36,"bool CaDiCaL::Solver::flippable(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pEVar30);
  pEVar29 = (External *)pEVar36->vsize;
  if (pEVar29 == (External *)0x0) {
    flippable();
LAB_0083d60d:
    flippable();
LAB_0083d612:
    flippable();
LAB_0083d617:
    flippable((Solver *)pEVar35);
    pEVar29 = pEVar35;
LAB_0083d61e:
    flippable();
  }
  else {
    if (*(long *)&pEVar36->max_var == 0) goto LAB_0083d60d;
    uVar34 = *(uint *)((long)&pEVar36->internal + 4);
    if ((uVar34 & 0x6e) == 0) goto LAB_0083d612;
    if (((ulong)pcVar40 & 0x7fffffff) == 0) goto LAB_0083d617;
    if (uVar34 != 0x20) goto LAB_0083d61e;
    if (pEVar29->propagator == (ExternalPropagator *)0x0) {
      bVar44 = External::flippable(pEVar29,(int)pcVar40);
      return bVar44;
    }
  }
  flippable();
  pEVar36 = (External *)((ulong)pcVar41 & 0xffffffff);
  bVar44 = *(long *)&pEVar29->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pEVar30 = (External *)CONCAT71((int7)((ulong)pEVar30 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pEVar30 = pEVar36;
    fprintf(pFVar2,"%s %d\n","failed");
    fflush(*(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar29,"bool CaDiCaL::Solver::failed(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pEVar30);
  pEVar35 = (External *)pEVar29->vsize;
  if (pEVar35 == (External *)0x0) {
    failed();
LAB_0083d6b5:
    failed();
LAB_0083d6ba:
    failed();
LAB_0083d6bf:
    failed((Solver *)pEVar36);
  }
  else {
    if (*(long *)&pEVar29->max_var == 0) goto LAB_0083d6b5;
    uVar34 = *(uint *)((long)&pEVar29->internal + 4);
    if ((uVar34 & 0x6e) == 0) goto LAB_0083d6ba;
    if (((ulong)pcVar41 & 0x7fffffff) == 0) goto LAB_0083d6bf;
    pEVar36 = pEVar35;
    if (uVar34 == 0x40) {
      bVar44 = External::failed(pEVar35,(int)pcVar41);
      return bVar44;
    }
  }
  failed();
  bVar44 = *(long *)&pEVar36->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar36->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar40 = (char *)CONCAT71((int7)((ulong)pEVar30 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    fprintf(pFVar2,"%s\n","constraint_failed");
    fflush(*(FILE **)&(pEVar36->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar41 = "bool CaDiCaL::Solver::constraint_failed()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar36,"bool CaDiCaL::Solver::constraint_failed()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  pEVar30 = (External *)pEVar36->vsize;
  if (pEVar30 == (External *)0x0) {
    constraint_failed();
LAB_0083d741:
    constraint_failed();
LAB_0083d746:
    constraint_failed();
  }
  else {
    if (*(long *)&pEVar36->max_var == 0) goto LAB_0083d741;
    uVar34 = *(uint *)((long)&pEVar36->internal + 4);
    if ((uVar34 & 0x6e) == 0) goto LAB_0083d746;
    if (uVar34 == 0x40) {
      bVar44 = External::failed_constraint(pEVar30);
      return bVar44;
    }
  }
  constraint_failed();
  pCVar37 = (CaDiCaL *)((ulong)pcVar41 & 0xffffffff);
  bVar44 = *(long *)&pEVar30->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pCVar31 = (CaDiCaL *)CONCAT71((int7)((ulong)pcVar40 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  uVar34 = (uint)pcVar41;
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pCVar31 = pCVar37;
    fprintf(pFVar2,"%s %d\n","fixed");
    fflush(*(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar40 = "int CaDiCaL::Solver::fixed(int) const";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar30,"int CaDiCaL::Solver::fixed(int) const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pCVar31);
  plVar32 = (long *)pEVar30->vsize;
  if (plVar32 == (long *)0x0) {
    fixed();
LAB_0083d82d:
    fixed();
LAB_0083d832:
    fixed();
  }
  else {
    if (*(long *)&pEVar30->max_var == 0) goto LAB_0083d82d;
    if (((ulong)pEVar30->internal & 0x6e00000000) == 0) goto LAB_0083d832;
    if (((ulong)pcVar41 & 0x7fffffff) != 0) {
      uVar23 = -uVar34;
      if (0 < (int)uVar34) {
        uVar23 = uVar34;
      }
      cVar22 = '\0';
      if (((int)uVar23 <= (int)plVar32[1]) &&
         (uVar23 = *(uint *)(plVar32[8] + (ulong)uVar23 * 4), uVar23 != 0)) {
        uVar20 = uVar23;
        if ((int)uVar23 < 1) {
          uVar20 = -uVar23;
        }
        uVar21 = -uVar23;
        if (-1 < (int)uVar34) {
          uVar21 = uVar23;
        }
        cVar22 = *(char *)(*(long *)(*plVar32 + 0x1d8) + (ulong)uVar20);
        if (cVar22 == '\0') {
          cVar28 = '\0';
        }
        else {
          cVar28 = '\0';
          if (*(int *)(*(long *)(*plVar32 + 0x2c8) + (ulong)uVar20 * 0x10) == 0) {
            cVar28 = cVar22;
          }
        }
        cVar22 = -cVar28;
        if (-1 < (int)uVar21) {
          cVar22 = cVar28;
        }
      }
      return (bool)cVar22;
    }
  }
  fixed();
  pSVar38 = (Solver *)((ulong)pcVar40 & 0xffffffff);
  pFVar2 = *(FILE **)(pCVar37 + 0x20);
  pSVar33 = (Solver *)
            CONCAT71((int7)((ulong)plVar32 >> 8),
                     pFVar2 == (FILE *)0x0 || *(long *)(pCVar37 + 8) == 0);
  if (pFVar2 != (FILE *)0x0 && *(long *)(pCVar37 + 8) != 0) {
    pSVar33 = pSVar38;
    fprintf(pFVar2,"%s %d\n","phase");
    fflush(*(FILE **)(pCVar37 + 0x20));
  }
  pcVar41 = "void CaDiCaL::Solver::phase(int)";
  require_solver_pointer_to_be_non_zero
            (pCVar37,"void CaDiCaL::Solver::phase(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  if (*(External **)(pCVar37 + 0x10) == (External *)0x0) {
    phase();
LAB_0083d8c5:
    phase();
LAB_0083d8ca:
    phase();
  }
  else {
    if (*(long *)(pCVar37 + 8) == 0) goto LAB_0083d8c5;
    if (((byte)pCVar37[4] & 0x7e) == 0) goto LAB_0083d8ca;
    if (((ulong)pcVar40 & 0x7fffffff) != 0) {
      External::phase(*(External **)(pCVar37 + 0x10),(int)pcVar40);
      return (bool)extraout_AL;
    }
  }
  phase(pSVar38);
  pSVar39 = (Solver *)((ulong)pcVar41 & 0xffffffff);
  bVar44 = pSVar38->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar38->trace_api_file;
  pSVar33 = (Solver *)CONCAT71((int7)((ulong)pSVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pSVar33 = pSVar39;
    fprintf(pFVar2,"%s %d\n","unphase");
    fflush((FILE *)pSVar38->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar38,"void CaDiCaL::Solver::unphase(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  if (pSVar38->external == (External *)0x0) {
    unphase();
LAB_0083d95d:
    unphase();
LAB_0083d962:
    unphase();
  }
  else {
    if (pSVar38->internal == (Internal *)0x0) goto LAB_0083d95d;
    if ((pSVar38->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) == 0)
    goto LAB_0083d962;
    if (((ulong)pcVar41 & 0x7fffffff) != 0) {
      External::unphase(pSVar38->external,(int)pcVar41);
      return (bool)extraout_AL_00;
    }
  }
  unphase(pSVar39);
  pcVar40 = "void CaDiCaL::Solver::terminate()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar39,"void CaDiCaL::Solver::terminate()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  pIVar27 = (Internal *)pSVar39->external;
  if (pIVar27 == (Internal *)0x0) {
    terminate();
LAB_0083d9a6:
    terminate();
  }
  else {
    if (pSVar39->internal == (Internal *)0x0) goto LAB_0083d9a6;
    if ((pSVar39->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      External::terminate((External *)pIVar27);
      return (bool)extraout_AL_01;
    }
  }
  terminate();
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"void CaDiCaL::Solver::connect_terminator(Terminator *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  sVar25 = *(size_t *)&pIVar27->external_prop_is_lazy;
  if (sVar25 == 0) {
    connect_terminator();
LAB_0083d9fd:
    connect_terminator();
LAB_0083da02:
    connect_terminator();
  }
  else {
    lVar8._0_1_ = pIVar27->preprocessing;
    lVar8._1_1_ = pIVar27->protected_reasons;
    lVar8._2_1_ = pIVar27->force_saved_phase;
    lVar8._3_1_ = pIVar27->searching_lucky_phases;
    lVar8._4_1_ = pIVar27->stable;
    lVar8._5_1_ = pIVar27->reported;
    lVar8._6_1_ = pIVar27->external_prop;
    lVar8._7_1_ = pIVar27->did_external_prop;
    if (lVar8 == 0) goto LAB_0083d9fd;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0083da02;
    if (pcVar40 != (char *)0x0) {
      *(char **)(sVar25 + 0x168) = pcVar40;
      return SUB81(sVar25,0);
    }
  }
  connect_terminator();
  pcVar40 = "void CaDiCaL::Solver::disconnect_terminator()";
  pIVar27 = pIVar43;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,"void CaDiCaL::Solver::disconnect_terminator()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  sVar25 = *(size_t *)&pIVar43->external_prop_is_lazy;
  if (sVar25 == 0) {
    disconnect_terminator();
LAB_0083da4b:
    disconnect_terminator();
  }
  else {
    lVar3._0_1_ = pIVar43->preprocessing;
    lVar3._1_1_ = pIVar43->protected_reasons;
    lVar3._2_1_ = pIVar43->force_saved_phase;
    lVar3._3_1_ = pIVar43->searching_lucky_phases;
    lVar3._4_1_ = pIVar43->stable;
    lVar3._5_1_ = pIVar43->reported;
    lVar3._6_1_ = pIVar43->external_prop;
    lVar3._7_1_ = pIVar43->did_external_prop;
    if (lVar3 == 0) goto LAB_0083da4b;
    if ((pIVar43->unsat & 0x6eU) != 0) {
      *(undefined8 *)(sVar25 + 0x168) = 0;
      return SUB81(sVar25,0);
    }
  }
  disconnect_terminator();
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"void CaDiCaL::Solver::connect_learner(Learner *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  sVar25 = *(size_t *)&pIVar27->external_prop_is_lazy;
  if (sVar25 == 0) {
    connect_learner();
LAB_0083daa3:
    connect_learner();
LAB_0083daa8:
    connect_learner();
  }
  else {
    lVar4._0_1_ = pIVar27->preprocessing;
    lVar4._1_1_ = pIVar27->protected_reasons;
    lVar4._2_1_ = pIVar27->force_saved_phase;
    lVar4._3_1_ = pIVar27->searching_lucky_phases;
    lVar4._4_1_ = pIVar27->stable;
    lVar4._5_1_ = pIVar27->reported;
    lVar4._6_1_ = pIVar27->external_prop;
    lVar4._7_1_ = pIVar27->did_external_prop;
    if (lVar4 == 0) goto LAB_0083daa3;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0083daa8;
    if (pcVar40 != (char *)0x0) {
      *(char **)(sVar25 + 0x170) = pcVar40;
      return SUB81(sVar25,0);
    }
  }
  connect_learner();
  pcVar40 = "void CaDiCaL::Solver::disconnect_learner()";
  pIVar27 = pIVar43;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,"void CaDiCaL::Solver::disconnect_learner()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  sVar25 = *(size_t *)&pIVar43->external_prop_is_lazy;
  if (sVar25 == 0) {
    disconnect_learner();
LAB_0083daf1:
    disconnect_learner();
  }
  else {
    lVar5._0_1_ = pIVar43->preprocessing;
    lVar5._1_1_ = pIVar43->protected_reasons;
    lVar5._2_1_ = pIVar43->force_saved_phase;
    lVar5._3_1_ = pIVar43->searching_lucky_phases;
    lVar5._4_1_ = pIVar43->stable;
    lVar5._5_1_ = pIVar43->reported;
    lVar5._6_1_ = pIVar43->external_prop;
    lVar5._7_1_ = pIVar43->did_external_prop;
    if (lVar5 == 0) goto LAB_0083daf1;
    if ((pIVar43->unsat & 0x6eU) != 0) {
      *(undefined8 *)(sVar25 + 0x170) = 0;
      return SUB81(sVar25,0);
    }
  }
  disconnect_learner();
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,
             "void CaDiCaL::Solver::connect_fixed_listener(FixedAssignmentListener *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  sVar25 = *(size_t *)&pIVar27->external_prop_is_lazy;
  if (sVar25 == 0) {
    connect_fixed_listener();
LAB_0083db5f:
    connect_fixed_listener();
LAB_0083db64:
    connect_fixed_listener();
  }
  else {
    lVar6._0_1_ = pIVar27->preprocessing;
    lVar6._1_1_ = pIVar27->protected_reasons;
    lVar6._2_1_ = pIVar27->force_saved_phase;
    lVar6._3_1_ = pIVar27->searching_lucky_phases;
    lVar6._4_1_ = pIVar27->stable;
    lVar6._5_1_ = pIVar27->reported;
    lVar6._6_1_ = pIVar27->external_prop;
    lVar6._7_1_ = pIVar27->did_external_prop;
    if (lVar6 == 0) goto LAB_0083db5f;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0083db64;
    if (pcVar40 != (char *)0x0) {
      if (*(long *)(sVar25 + 0x178) != 0) {
        disconnect_fixed_listener((Solver *)pIVar27);
        sVar25._0_1_ = pIVar27->external_prop_is_lazy;
        sVar25._1_1_ = pIVar27->forced_backt_allowed;
        sVar25._2_1_ = pIVar27->private_steps;
        sVar25._3_1_ = pIVar27->rephased;
        sVar25._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
      }
      *(char **)(sVar25 + 0x178) = pcVar40;
      return SUB81(sVar25,0);
    }
  }
  connect_fixed_listener();
  pcVar40 = "void CaDiCaL::Solver::disconnect_fixed_listener()";
  pIVar27 = pIVar43;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,"void CaDiCaL::Solver::disconnect_fixed_listener()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  sVar25 = *(size_t *)&pIVar43->external_prop_is_lazy;
  if (sVar25 == 0) {
    disconnect_fixed_listener();
LAB_0083dbad:
    disconnect_fixed_listener();
  }
  else {
    lVar7._0_1_ = pIVar43->preprocessing;
    lVar7._1_1_ = pIVar43->protected_reasons;
    lVar7._2_1_ = pIVar43->force_saved_phase;
    lVar7._3_1_ = pIVar43->searching_lucky_phases;
    lVar7._4_1_ = pIVar43->stable;
    lVar7._5_1_ = pIVar43->reported;
    lVar7._6_1_ = pIVar43->external_prop;
    lVar7._7_1_ = pIVar43->did_external_prop;
    if (lVar7 == 0) goto LAB_0083dbad;
    if ((pIVar43->unsat & 0x6eU) != 0) {
      *(undefined8 *)(sVar25 + 0x178) = 0;
      return SUB81(sVar25,0);
    }
  }
  disconnect_fixed_listener();
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,
             "void CaDiCaL::Solver::connect_external_propagator(ExternalPropagator *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  sVar26 = *(size_t *)&pIVar27->external_prop_is_lazy;
  if (sVar26 == 0) {
    connect_external_propagator();
LAB_0083dc34:
    connect_external_propagator();
LAB_0083dc39:
    connect_external_propagator();
  }
  else {
    pIVar43 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar43 == (Internal *)0x0) goto LAB_0083dc34;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0083dc39;
    if (pcVar40 != (char *)0x0) {
      if (*(long *)(sVar26 + 0x180) != 0) {
        disconnect_external_propagator((Solver *)pIVar27);
        pIVar43 = *(Internal **)&pIVar27->preprocessing;
        sVar26._0_1_ = pIVar27->external_prop_is_lazy;
        sVar26._1_1_ = pIVar27->forced_backt_allowed;
        sVar26._2_1_ = pIVar27->private_steps;
        sVar26._3_1_ = pIVar27->rephased;
        sVar26._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
      }
      *(char **)(sVar26 + 0x180) = pcVar40;
      Internal::connect_propagator(pIVar43);
      lVar8 = *(long *)&pIVar27->preprocessing;
      *(undefined1 *)(lVar8 + 0xe) = 1;
      *(char *)(lVar8 + 0x10) = pcVar40[8];
      return SUB81(lVar8,0);
    }
  }
  connect_external_propagator();
  pcVar40 = "void CaDiCaL::Solver::disconnect_external_propagator()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,"void CaDiCaL::Solver::disconnect_external_propagator()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  pEVar30 = *(External **)&pIVar43->external_prop_is_lazy;
  if (pEVar30 == (External *)0x0) {
    disconnect_external_propagator();
LAB_0083dcb0:
    disconnect_external_propagator();
  }
  else {
    pIVar27 = *(Internal **)&pIVar43->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0083dcb0;
    if ((pIVar43->unsat & 0x6eU) != 0) {
      if (pEVar30->propagator != (ExternalPropagator *)0x0) {
        External::reset_observed_vars(pEVar30);
        pIVar27 = *(Internal **)&pIVar43->preprocessing;
        pEVar30 = *(External **)&pIVar43->external_prop_is_lazy;
      }
      pEVar30->propagator = (ExternalPropagator *)0x0;
      Internal::set_tainted_literal(pIVar27);
      lVar8 = *(long *)&pIVar43->preprocessing;
      *(undefined1 *)(lVar8 + 0xe) = 0;
      *(undefined1 *)(lVar8 + 0x10) = 1;
      return SUB81(lVar8,0);
    }
  }
  disconnect_external_propagator();
  pSVar38 = (Solver *)((ulong)pcVar40 & 0xffffffff);
  bVar44 = *(long *)&pEVar30->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar33 = (Solver *)CONCAT71((int7)((ulong)pSVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pSVar33 = pSVar38;
    fprintf(pFVar2,"%s %d\n","observe");
    fflush(*(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar41 = "void CaDiCaL::Solver::add_observed_var(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar30,"void CaDiCaL::Solver::add_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  if ((External *)pEVar30->vsize == (External *)0x0) {
    add_observed_var();
LAB_0083dd41:
    add_observed_var();
LAB_0083dd46:
    add_observed_var();
  }
  else {
    if (*(long *)&pEVar30->max_var == 0) goto LAB_0083dd41;
    if (((ulong)pEVar30->internal & 0x7e00000000) == 0) goto LAB_0083dd46;
    if (((ulong)pcVar40 & 0x7fffffff) != 0) {
      External::add_observed_var((External *)pEVar30->vsize,(int)pcVar40);
      return (bool)extraout_AL_02;
    }
  }
  add_observed_var(pSVar38);
  pSVar39 = (Solver *)((ulong)pcVar41 & 0xffffffff);
  bVar44 = pSVar38->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar38->trace_api_file;
  pSVar33 = (Solver *)CONCAT71((int7)((ulong)pSVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pSVar33 = pSVar39;
    fprintf(pFVar2,"%s %d\n","unobserve");
    fflush((FILE *)pSVar38->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar38,"void CaDiCaL::Solver::remove_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  if (pSVar38->external == (External *)0x0) {
    remove_observed_var();
LAB_0083ddd9:
    remove_observed_var();
LAB_0083ddde:
    remove_observed_var();
  }
  else {
    if (pSVar38->internal == (Internal *)0x0) goto LAB_0083ddd9;
    if ((pSVar38->_state & VALID) == 0) goto LAB_0083ddde;
    if (((ulong)pcVar41 & 0x7fffffff) != 0) {
      External::remove_observed_var(pSVar38->external,(int)pcVar41);
      return (bool)extraout_AL_03;
    }
  }
  remove_observed_var(pSVar39);
  bVar44 = pSVar39->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar39->trace_api_file;
  pcVar40 = (char *)CONCAT71((int7)((ulong)pSVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    fprintf(pFVar2,"%s\n","reset_observed_vars");
    fflush((FILE *)pSVar39->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar39,"void CaDiCaL::Solver::reset_observed_vars()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  pEVar30 = pSVar39->external;
  if (pEVar30 == (External *)0x0) {
    reset_observed_vars();
LAB_0083de59:
    reset_observed_vars();
  }
  else {
    if (pSVar39->internal == (Internal *)0x0) goto LAB_0083de59;
    if ((pSVar39->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      External::reset_observed_vars(pEVar30);
      return (bool)extraout_AL_04;
    }
  }
  reset_observed_vars();
  bVar44 = *(long *)&pEVar30->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar40 = (char *)CONCAT71((int7)((ulong)pcVar40 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    fprintf(pFVar2,"%s\n","active");
    fflush(*(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar29 = pEVar30;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar30,"int CaDiCaL::Solver::active() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  if (pEVar30->vsize == 0) {
    active();
LAB_0083ded5:
    active();
  }
  else {
    if (*(long *)&pEVar30->max_var == 0) goto LAB_0083ded5;
    if (((ulong)pEVar30->internal & 0x6e00000000) != 0) {
      return SUB41(*(undefined4 *)(*(long *)&pEVar30->max_var + 0x15a8),0);
    }
  }
  active();
  bVar44 = *(long *)&pEVar29->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar40 = (char *)CONCAT71((int7)((ulong)pcVar40 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    fprintf(pFVar2,"%s\n","redundant");
    fflush(*(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar30 = pEVar29;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar29,"int64_t CaDiCaL::Solver::redundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  if (pEVar29->vsize == 0) {
    redundant();
LAB_0083df52:
    redundant();
  }
  else {
    if (*(long *)&pEVar29->max_var == 0) goto LAB_0083df52;
    if (((ulong)pEVar29->internal & 0x6e00000000) != 0) {
      return SUB81(*(undefined8 *)(*(long *)&pEVar29->max_var + 0x1078),0);
    }
  }
  redundant();
  bVar44 = *(long *)&pEVar30->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar40 = (char *)CONCAT71((int7)((ulong)pcVar40 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    fprintf(pFVar2,"%s\n","irredundant");
    fflush(*(FILE **)&(pEVar30->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar41 = "int64_t CaDiCaL::Solver::irredundant() const";
  pEVar29 = pEVar30;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar30,"int64_t CaDiCaL::Solver::irredundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  if (pEVar30->vsize == 0) {
    irredundant();
LAB_0083dfce:
    irredundant();
  }
  else {
    if (*(long *)&pEVar30->max_var == 0) goto LAB_0083dfce;
    if (((ulong)pEVar30->internal & 0x6e00000000) != 0) {
      return SUB81(*(undefined8 *)(*(long *)&pEVar30->max_var + 0x1080),0);
    }
  }
  irredundant();
  pSVar38 = (Solver *)((ulong)pcVar41 & 0xffffffff);
  bVar44 = *(long *)&pEVar29->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar33 = (Solver *)CONCAT71((int7)((ulong)pcVar40 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pSVar33 = pSVar38;
    fprintf(pFVar2,"%s %d\n","freeze");
    fflush(*(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar40 = "void CaDiCaL::Solver::freeze(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar29,"void CaDiCaL::Solver::freeze(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  if ((External *)pEVar29->vsize == (External *)0x0) {
    freeze();
LAB_0083e05f:
    freeze();
LAB_0083e064:
    freeze();
  }
  else {
    if (*(long *)&pEVar29->max_var == 0) goto LAB_0083e05f;
    if (((ulong)pEVar29->internal & 0x6e00000000) == 0) goto LAB_0083e064;
    if (((ulong)pcVar41 & 0x7fffffff) != 0) {
      External::freeze((External *)pEVar29->vsize,(int)pcVar41);
      return (bool)extraout_AL_05;
    }
  }
  freeze(pSVar38);
  pSVar39 = (Solver *)((ulong)pcVar40 & 0xffffffff);
  bVar44 = pSVar38->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar38->trace_api_file;
  pSVar33 = (Solver *)CONCAT71((int7)((ulong)pSVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pSVar33 = pSVar39;
    fprintf(pFVar2,"%s %d\n","melt");
    fflush((FILE *)pSVar38->trace_api_file);
  }
  pcVar41 = "void CaDiCaL::Solver::melt(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar38,"void CaDiCaL::Solver::melt(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar33->adding_clause);
  pEVar30 = pSVar38->external;
  if (pEVar30 == (External *)0x0) {
LAB_0083e126:
    melt();
LAB_0083e12b:
    melt();
LAB_0083e130:
    melt();
  }
  else {
    if (pSVar38->internal == (Internal *)0x0) goto LAB_0083e12b;
    if ((pSVar38->_state & VALID) == 0) goto LAB_0083e130;
    if (((ulong)pcVar40 & 0x7fffffff) != 0) {
      uVar23 = (uint)pcVar40;
      uVar34 = -uVar23;
      if (0 < (int)uVar23) {
        uVar34 = uVar23;
      }
      if ((((int)uVar34 <= pEVar30->max_var) &&
          (pSVar33 = (Solver *)
                     (pEVar30->frozentab).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
          (int)uVar34 <
          (int)((ulong)((long)(pEVar30->frozentab).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar33) >> 2))) &&
         (*(int *)(&pSVar33->adding_clause + (ulong)uVar34 * 4) != 0)) {
        External::melt(pEVar30,uVar23);
        return (bool)extraout_AL_06;
      }
      melt(pSVar39);
      goto LAB_0083e126;
    }
  }
  melt(pSVar39);
  pCVar37 = (CaDiCaL *)((ulong)pcVar41 & 0xffffffff);
  bVar44 = pSVar39->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar39->trace_api_file;
  pCVar31 = (CaDiCaL *)CONCAT71((int7)((ulong)pSVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar44);
  if (pFVar2 != (FILE *)0x0 && !bVar44) {
    pCVar31 = pCVar37;
    fprintf(pFVar2,"%s %d\n","frozen");
    fflush((FILE *)pSVar39->trace_api_file);
  }
  pcVar40 = "bool CaDiCaL::Solver::frozen(int) const";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar39,"bool CaDiCaL::Solver::frozen(int) const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pCVar31);
  pEVar30 = pSVar39->external;
  if (pEVar30 == (External *)0x0) {
    frozen();
LAB_0083e1ef:
    frozen();
LAB_0083e1f4:
    frozen();
  }
  else {
    if (pSVar39->internal == (Internal *)0x0) goto LAB_0083e1ef;
    if ((pSVar39->_state & VALID) == 0) goto LAB_0083e1f4;
    if (((ulong)pcVar41 & 0x7fffffff) != 0) {
      uVar23 = (uint)pcVar41;
      uVar34 = -uVar23;
      if (0 < (int)uVar23) {
        uVar34 = uVar23;
      }
      if ((pEVar30->max_var < (int)uVar34) ||
         (puVar9 = (pEVar30->frozentab).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (int)((ulong)((long)(pEVar30->frozentab).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar9) >> 2) <= (int)uVar34
         )) {
        bVar44 = false;
      }
      else {
        bVar44 = puVar9[uVar34] != 0;
      }
      return bVar44;
    }
  }
  frozen();
  pFVar2 = *(FILE **)(pCVar37 + 0x20);
  pIVar27 = (Internal *)
            CONCAT71((int7)((ulong)pCVar31 >> 8),
                     pFVar2 == (FILE *)0x0 || *(long *)(pCVar37 + 8) == 0);
  if (pFVar2 != (FILE *)0x0 && *(long *)(pCVar37 + 8) != 0) {
    pIVar27 = this_00;
    fprintf(pFVar2,"%s %s\n","trace_proof");
    fflush(*(FILE **)(pCVar37 + 0x20));
  }
  print = 0x90;
  require_solver_pointer_to_be_non_zero
            (pCVar37,"bool CaDiCaL::Solver::trace_proof(FILE *, const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pIVar27);
  if (*(long *)(pCVar37 + 0x10) == 0) {
    trace_proof();
LAB_0083e29c:
    trace_proof();
LAB_0083e2a1:
    trace_proof();
  }
  else {
    if (*(long *)(pCVar37 + 8) == 0) goto LAB_0083e29c;
    if ((*(uint *)(pCVar37 + 4) & 0x6e) == 0) goto LAB_0083e2a1;
    if (*(uint *)(pCVar37 + 4) == 2) {
      file = (File *)File::write((int)*(long *)(pCVar37 + 8),pcVar40,(size_t)this_00);
      Internal::trace(*(Internal **)(pCVar37 + 8),file);
      return true;
    }
  }
  pIVar43 = this_00;
  trace_proof((Solver *)this_00);
  lVar10._0_1_ = pIVar43->preprocessing;
  lVar10._1_1_ = pIVar43->protected_reasons;
  lVar10._2_1_ = pIVar43->force_saved_phase;
  lVar10._3_1_ = pIVar43->searching_lucky_phases;
  lVar10._4_1_ = pIVar43->stable;
  lVar10._5_1_ = pIVar43->reported;
  lVar10._6_1_ = pIVar43->external_prop;
  lVar10._7_1_ = pIVar43->did_external_prop;
  pFVar2 = (FILE *)(pIVar43->reluctant).v;
  pcVar40 = (char *)CONCAT71((int7)((ulong)pIVar27 >> 8),pFVar2 == (FILE *)0x0 || lVar10 == 0);
  if (pFVar2 != (FILE *)0x0 && lVar10 != 0) {
    fprintf(pFVar2,"%s\n","close_proof_trace");
    fflush((FILE *)(pIVar43->reluctant).v);
  }
  pcVar41 = "void CaDiCaL::Solver::close_proof_trace(bool)";
  pIVar27 = pIVar43;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,"void CaDiCaL::Solver::close_proof_trace(bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar11._0_1_ = pIVar43->external_prop_is_lazy;
  lVar11._1_1_ = pIVar43->forced_backt_allowed;
  lVar11._2_1_ = pIVar43->private_steps;
  lVar11._3_1_ = pIVar43->rephased;
  lVar11._4_4_ = *(undefined4 *)&pIVar43->field_0x14;
  if (lVar11 == 0) {
    close_proof_trace();
LAB_0083e351:
    close_proof_trace();
LAB_0083e356:
    close_proof_trace();
LAB_0083e35b:
    close_proof_trace();
  }
  else {
    lVar8 = *(long *)&pIVar43->preprocessing;
    if (lVar8 == 0) goto LAB_0083e351;
    if ((pIVar43->unsat & 0x6eU) == 0) goto LAB_0083e356;
    pcVar40 = *(char **)(lVar8 + 0xc50);
    if (*(char **)(lVar8 + 0xc48) == pcVar40) goto LAB_0083e35b;
    pIVar27 = *(Internal **)(pcVar40 + -8);
    cVar22 = (**(code **)(*(long *)pIVar27 + 0x98))();
    if (cVar22 == '\0') {
      Internal::close_trace(*(Internal **)&pIVar43->preprocessing,(bool)print);
      return (bool)extraout_AL_07;
    }
  }
  close_proof_trace();
  bVar44 = SUB81(pcVar40,0);
  pcVar42 = "void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)";
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar12._0_1_ = pIVar27->external_prop_is_lazy;
  lVar12._1_1_ = pIVar27->forced_backt_allowed;
  lVar12._2_1_ = pIVar27->private_steps;
  lVar12._3_1_ = pIVar27->rephased;
  lVar12._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar12 == 0) {
    connect_proof_tracer();
LAB_0083e3cc:
    connect_proof_tracer();
LAB_0083e3d1:
    connect_proof_tracer();
LAB_0083e3d6:
    connect_proof_tracer();
  }
  else {
    pIVar43 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar43 == (Internal *)0x0) goto LAB_0083e3cc;
    uVar34._0_1_ = pIVar27->unsat;
    uVar34._1_1_ = pIVar27->iterating;
    uVar34._2_1_ = pIVar27->localsearching;
    uVar34._3_1_ = pIVar27->lookingahead;
    if ((uVar34 & 0x6e) == 0) goto LAB_0083e3d1;
    if (uVar34 != 2) goto LAB_0083e3d6;
    if ((Tracer *)pcVar41 != (Tracer *)0x0) {
      Internal::connect_proof_tracer(pIVar43,(Tracer *)pcVar41,antecedents,bVar44);
      return (bool)extraout_AL_08;
    }
  }
  connect_proof_tracer();
  bVar44 = SUB81(pcVar40,0);
  pcVar41 = "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)";
  pIVar27 = pIVar43;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,
             "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar13._0_1_ = pIVar43->external_prop_is_lazy;
  lVar13._1_1_ = pIVar43->forced_backt_allowed;
  lVar13._2_1_ = pIVar43->private_steps;
  lVar13._3_1_ = pIVar43->rephased;
  lVar13._4_4_ = *(undefined4 *)&pIVar43->field_0x14;
  if (lVar13 == 0) {
    connect_proof_tracer();
LAB_0083e446:
    connect_proof_tracer();
LAB_0083e44b:
    connect_proof_tracer();
LAB_0083e450:
    connect_proof_tracer();
  }
  else {
    pIVar27 = *(Internal **)&pIVar43->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0083e446;
    uVar23._0_1_ = pIVar43->unsat;
    uVar23._1_1_ = pIVar43->iterating;
    uVar23._2_1_ = pIVar43->localsearching;
    uVar23._3_1_ = pIVar43->lookingahead;
    if ((uVar23 & 0x6e) == 0) goto LAB_0083e44b;
    if (uVar23 != 2) goto LAB_0083e450;
    if ((InternalTracer *)pcVar42 != (InternalTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar27,(InternalTracer *)pcVar42,antecedents_00,bVar44);
      return (bool)extraout_AL_09;
    }
  }
  connect_proof_tracer();
  bVar44 = SUB81(pcVar40,0);
  pcVar42 = "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)";
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,
             "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar14._0_1_ = pIVar27->external_prop_is_lazy;
  lVar14._1_1_ = pIVar27->forced_backt_allowed;
  lVar14._2_1_ = pIVar27->private_steps;
  lVar14._3_1_ = pIVar27->rephased;
  lVar14._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar14 == 0) {
    connect_proof_tracer();
LAB_0083e4c0:
    connect_proof_tracer();
LAB_0083e4c5:
    connect_proof_tracer();
LAB_0083e4ca:
    connect_proof_tracer();
  }
  else {
    pIVar43 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar43 == (Internal *)0x0) goto LAB_0083e4c0;
    uVar20._0_1_ = pIVar27->unsat;
    uVar20._1_1_ = pIVar27->iterating;
    uVar20._2_1_ = pIVar27->localsearching;
    uVar20._3_1_ = pIVar27->lookingahead;
    if ((uVar20 & 0x6e) == 0) goto LAB_0083e4c5;
    if (uVar20 != 2) goto LAB_0083e4ca;
    if ((StatTracer *)pcVar41 != (StatTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar43,(StatTracer *)pcVar41,antecedents_01,bVar44);
      return (bool)extraout_AL_10;
    }
  }
  connect_proof_tracer();
  bVar44 = SUB81(pcVar40,0);
  pcVar41 = "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)";
  pIVar27 = pIVar43;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,
             "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar15._0_1_ = pIVar43->external_prop_is_lazy;
  lVar15._1_1_ = pIVar43->forced_backt_allowed;
  lVar15._2_1_ = pIVar43->private_steps;
  lVar15._3_1_ = pIVar43->rephased;
  lVar15._4_4_ = *(undefined4 *)&pIVar43->field_0x14;
  if (lVar15 == 0) {
    connect_proof_tracer();
LAB_0083e53a:
    connect_proof_tracer();
LAB_0083e53f:
    connect_proof_tracer();
LAB_0083e544:
    connect_proof_tracer();
  }
  else {
    pIVar27 = *(Internal **)&pIVar43->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0083e53a;
    uVar21._0_1_ = pIVar43->unsat;
    uVar21._1_1_ = pIVar43->iterating;
    uVar21._2_1_ = pIVar43->localsearching;
    uVar21._3_1_ = pIVar43->lookingahead;
    if ((uVar21 & 0x6e) == 0) goto LAB_0083e53f;
    if (uVar21 != 2) goto LAB_0083e544;
    if ((FileTracer *)pcVar42 != (FileTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar27,(FileTracer *)pcVar42,antecedents_02,bVar44);
      return (bool)extraout_AL_11;
    }
  }
  connect_proof_tracer();
  pcVar42 = "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)";
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar16._0_1_ = pIVar27->external_prop_is_lazy;
  lVar16._1_1_ = pIVar27->forced_backt_allowed;
  lVar16._2_1_ = pIVar27->private_steps;
  lVar16._3_1_ = pIVar27->rephased;
  lVar16._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar16 == 0) {
    disconnect_proof_tracer();
LAB_0083e59b:
    disconnect_proof_tracer();
LAB_0083e5a0:
    disconnect_proof_tracer();
  }
  else {
    pIVar43 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar43 == (Internal *)0x0) goto LAB_0083e59b;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0083e5a0;
    if ((Tracer *)pcVar41 != (Tracer *)0x0) {
      bVar44 = Internal::disconnect_proof_tracer(pIVar43,(Tracer *)pcVar41);
      return bVar44;
    }
  }
  disconnect_proof_tracer();
  pcVar41 = "bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)";
  pIVar27 = pIVar43;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,"bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar17._0_1_ = pIVar43->external_prop_is_lazy;
  lVar17._1_1_ = pIVar43->forced_backt_allowed;
  lVar17._2_1_ = pIVar43->private_steps;
  lVar17._3_1_ = pIVar43->rephased;
  lVar17._4_4_ = *(undefined4 *)&pIVar43->field_0x14;
  if (lVar17 == 0) {
    disconnect_proof_tracer();
LAB_0083e5f7:
    disconnect_proof_tracer();
LAB_0083e5fc:
    disconnect_proof_tracer();
  }
  else {
    pIVar27 = *(Internal **)&pIVar43->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0083e5f7;
    if ((pIVar43->unsat & 0x6eU) == 0) goto LAB_0083e5fc;
    if ((StatTracer *)pcVar42 != (StatTracer *)0x0) {
      bVar44 = Internal::disconnect_proof_tracer(pIVar27,(StatTracer *)pcVar42);
      return bVar44;
    }
  }
  disconnect_proof_tracer();
  pIVar43 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"bool CaDiCaL::Solver::disconnect_proof_tracer(FileTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  lVar18._0_1_ = pIVar27->external_prop_is_lazy;
  lVar18._1_1_ = pIVar27->forced_backt_allowed;
  lVar18._2_1_ = pIVar27->private_steps;
  lVar18._3_1_ = pIVar27->rephased;
  lVar18._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar18 == 0) {
    disconnect_proof_tracer();
LAB_0083e653:
    disconnect_proof_tracer();
LAB_0083e658:
    disconnect_proof_tracer();
  }
  else {
    pIVar43 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar43 == (Internal *)0x0) goto LAB_0083e653;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0083e658;
    if ((FileTracer *)pcVar41 != (FileTracer *)0x0) {
      bVar44 = Internal::disconnect_proof_tracer(pIVar43,(FileTracer *)pcVar41);
      return bVar44;
    }
  }
  disconnect_proof_tracer();
  lVar19._0_1_ = pIVar43->preprocessing;
  lVar19._1_1_ = pIVar43->protected_reasons;
  lVar19._2_1_ = pIVar43->force_saved_phase;
  lVar19._3_1_ = pIVar43->searching_lucky_phases;
  lVar19._4_1_ = pIVar43->stable;
  lVar19._5_1_ = pIVar43->reported;
  lVar19._6_1_ = pIVar43->external_prop;
  lVar19._7_1_ = pIVar43->did_external_prop;
  pFVar2 = (FILE *)(pIVar43->reluctant).v;
  pcVar40 = (char *)CONCAT71((int7)((ulong)pcVar40 >> 8),pFVar2 == (FILE *)0x0 || lVar19 == 0);
  if (pFVar2 != (FILE *)0x0 && lVar19 != 0) {
    fprintf(pFVar2,"%s\n","conclude");
    fflush((FILE *)(pIVar43->reluctant).v);
  }
  pcVar41 = "void CaDiCaL::Solver::conclude()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar43,"void CaDiCaL::Solver::conclude()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar40);
  pEVar30 = *(External **)&pIVar43->external_prop_is_lazy;
  if (pEVar30 == (External *)0x0) {
    conclude();
LAB_0083e6f3:
    conclude();
  }
  else {
    if (*(Internal **)&pIVar43->preprocessing == (Internal *)0x0) goto LAB_0083e6f3;
    uVar1._0_1_ = pIVar43->unsat;
    uVar1._1_1_ = pIVar43->iterating;
    uVar1._2_1_ = pIVar43->localsearching;
    uVar1._3_1_ = pIVar43->lookingahead;
    if ((uVar1 & 0x6e) != 0) {
      if (uVar1 == 4) {
        External::conclude_unknown(pEVar30);
        return (bool)extraout_AL_14;
      }
      if (uVar1 == 0x20) {
        External::conclude_sat(pEVar30);
        return (bool)extraout_AL_13;
      }
      if (uVar1 == 0x40) {
        Internal::conclude_unsat(*(Internal **)&pIVar43->preprocessing);
        return (bool)extraout_AL_12;
      }
      goto LAB_0083e6fd;
    }
  }
  conclude();
LAB_0083e6fd:
  conclude();
  bVar44 = _stderr != pEVar30;
  if (bVar44) {
    this_01 = (undefined1 *)0x0;
  }
  else {
    this_01 = terr;
  }
  bVar45 = _stdout == pEVar30;
  if (bVar45) {
    this_01 = tout;
  }
  pcVar40 = CaDiCaL::version();
  pcVar42 = identifier();
  __s = compiler();
  __s_00 = date();
  __s_01 = flags();
  fputs(pcVar41,(FILE *)pEVar30);
  if (bVar45 || !bVar44) {
    Terminal::color((Terminal *)this_01,0x23,false);
    fputs("Version ",(FILE *)pEVar30);
    Terminal::code((Terminal *)this_01,"0m");
    fputs(pcVar40,(FILE *)pEVar30);
    if (pcVar42 != (char *)0x0) {
      Terminal::color((Terminal *)this_01,0x23,false);
      fputc(0x20,(FILE *)pEVar30);
      fputs(pcVar42,(FILE *)pEVar30);
      Terminal::code((Terminal *)this_01,"0m");
    }
  }
  else {
    fputs("Version ",(FILE *)pEVar30);
    fputs(pcVar40,(FILE *)pEVar30);
    if (pcVar42 != (char *)0x0) {
      fputc(0x20,(FILE *)pEVar30);
      fputs(pcVar42,(FILE *)pEVar30);
    }
  }
  fputc(10,(FILE *)pEVar30);
  if (__s != (char *)0x0) {
    fputs(pcVar41,(FILE *)pEVar30);
    if (bVar45 || !bVar44) {
      Terminal::color((Terminal *)this_01,0x23,false);
    }
    fputs(__s,(FILE *)pEVar30);
    if (__s_01 != (char *)0x0) {
      fputc(0x20,(FILE *)pEVar30);
      fputs(__s_01,(FILE *)pEVar30);
    }
    if (bVar45 || !bVar44) {
      Terminal::code((Terminal *)this_01,"0m");
    }
    fputc(10,(FILE *)pEVar30);
  }
  if (__s_00 != (char *)0x0) {
    fputs(pcVar41,(FILE *)pEVar30);
    if (bVar45 || !bVar44) {
      Terminal::color((Terminal *)this_01,0x23,false);
      fputs(__s_00,(FILE *)pEVar30);
      Terminal::code((Terminal *)this_01,"0m");
    }
    else {
      fputs(__s_00,(FILE *)pEVar30);
    }
    fputc(10,(FILE *)pEVar30);
  }
  iVar24 = fflush((FILE *)pEVar30);
  return SUB41(iVar24,0);
}

Assistant:

bool Solver::flip (int lit) {
  TRACE ("flip", lit);
  REQUIRE_VALID_STATE ();
  REQUIRE_VALID_LIT (lit);
  REQUIRE (state () == SATISFIED, "can only flip value in satisfied state");
  REQUIRE (!external->propagator,
           "can only flip when no external propagator is present");
  bool res = external->flip (lit);
  LOG_API_CALL_RETURNS ("flip", lit, res);
  assert (state () == SATISFIED);
  return res;
}